

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::QueuePopMethod::QueuePopMethod
          (QueuePopMethod *this,KnownSystemName knownNameId,bool front)

{
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,knownNameId,Function);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_00588c78;
  this->front = front;
  return;
}

Assistant:

QueuePopMethod(KnownSystemName knownNameId, bool front) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), front(front) {}